

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection * iotlb_to_section_ppc(CPUState_conflict *cpu,hwaddr index,MemTxAttrs attrs)

{
  int iVar1;
  MemoryRegionSection *sections;
  AddressSpaceDispatch *d;
  CPUAddressSpace *cpuas;
  int asidx;
  hwaddr index_local;
  CPUState_conflict *cpu_local;
  MemTxAttrs attrs_local;
  
  iVar1 = cpu_asidx_from_attrs(cpu,attrs);
  return ((cpu->cpu_ases[iVar1].memory_dispatch)->map).sections + (index & 0xfff);
}

Assistant:

MemoryRegionSection *iotlb_to_section(CPUState *cpu,
                                      hwaddr index, MemTxAttrs attrs)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    CPUAddressSpace *cpuas = &cpu->cpu_ases[asidx];
    AddressSpaceDispatch *d = cpuas->memory_dispatch;
    MemoryRegionSection *sections = d->map.sections;

    return &sections[index & ~TARGET_PAGE_MASK];
}